

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunPool.h
# Opt level: O3

void __thiscall RunPool<int>::AddFront(RunPool<int> *this,int *value)

{
  bool *pbVar1;
  RunBlock<int> *pRVar2;
  RunBlock<int> *pRVar3;
  uint uVar4;
  
  pRVar2 = next_free_;
  pRVar3 = this->begin_front_;
  if (pRVar3 == (RunBlock<int> *)0x0) {
    pRVar3 = next_free_ + 1;
    this->begin_front_ = next_free_;
    next_free_ = pRVar3;
    pRVar2->next_free_pos_ = 799;
    pRVar2->is_front = true;
    pRVar3 = this->begin_back_;
    pRVar2->next = pRVar3;
    this->end_front_ = pRVar2;
    pRVar3->prev = pRVar2;
    uVar4 = 799;
    pRVar3 = pRVar2;
  }
  else {
    uVar4 = pRVar3->next_free_pos_;
    if ((int)uVar4 < 0) {
      pbVar1 = &next_free_->is_front;
      next_free_ = next_free_ + 1;
      *pbVar1 = true;
      pRVar2->next = pRVar3;
      pRVar2->values[799] = *value;
      pRVar2->next_free_pos_ = 0x31e;
      pRVar3->prev = pRVar2;
      this->begin_front_ = pRVar2;
      this->size_ = this->size_ + 800;
      return;
    }
  }
  pRVar3->values[uVar4] = *value;
  pRVar3->next_free_pos_ = uVar4 - 1;
  return;
}

Assistant:

void AddFront(ValueType &value) {
        if(begin_front_ == NULL) {
            begin_front_ = Alloc();
            begin_front_->next_free_pos_ = kValuesPerBlock - 1;
            begin_front_->is_front = true;
            begin_front_->next = begin_back_;

            end_front_ = begin_front_;
            begin_back_->prev = end_front_;
        }

        if(begin_front_->next_free_pos_ < 0) {
            RunBlock<ValueType>* temp = Alloc();
            temp->is_front = true;
            temp->next = begin_front_;
            temp->values[kValuesPerBlock - 1] = value;
            temp->next_free_pos_ = kValuesPerBlock - 2;

            begin_front_->prev = temp;
            begin_front_ = temp;
            size_ += kValuesPerBlock;

        } else {
            begin_front_->values[begin_front_->next_free_pos_] = value;
            begin_front_->next_free_pos_--;
        }
    }